

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraph.h
# Opt level: O0

type __thiscall
dg::pta::PointerGraph::nodeFactory<(dg::pta::PSNodeType)12,dg::pta::PSNode*&,dg::pta::PSNodeRet>
          (PointerGraph *this,PSNode **args)

{
  type pPVar1;
  PSNodeRet *in_RSI;
  PointerGraph *in_RDI;
  
  pPVar1 = (type)operator_new(0x100);
  getNewNodeId(in_RDI);
  PSNodeRet::PSNodeRet<dg::pta::PSNode*&>(in_RSI,(IDType)((ulong)pPVar1 >> 0x20),(PSNode **)in_RDI);
  return pPVar1;
}

Assistant:

typename std::enable_if<!std::is_same<Node, PSNode>::value, Node *>::type
    nodeFactory(Args &&...args) {
        return new Node(getNewNodeId(), std::forward<Args>(args)...);
    }